

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint factor;
  
  if ((int)CONCAT62(in_register_00000032,base) == 0) {
    __assert_fail("base != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19d,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (power_exponent < 0) {
    __assert_fail("power_exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19e,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (power_exponent == 0) {
    AssignUInt16(this,1);
    return;
  }
  uVar2 = CONCAT62(in_register_00000032,base) & 0xffffffff;
  Zero(this);
  if ((base & 1) == 0) {
    iVar9 = 0;
    do {
      uVar2 = (uVar2 & 0xffff) >> 1;
      iVar9 = iVar9 + 1;
      factor = (uint)uVar2;
    } while ((uVar2 & 1) == 0);
  }
  else {
    factor = (uint)base;
    iVar9 = 0;
  }
  uVar8 = 0x1f;
  if (factor != 0) {
    for (; factor >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  iVar3 = (uVar8 ^ 0xffffffe0) + 0x21;
  if (factor == 0) {
    iVar3 = 0;
  }
  if ((uint)(iVar3 * power_exponent) < 0xde4) {
    uVar8 = 1;
    do {
      uVar5 = uVar8;
      uVar8 = uVar5 * 2;
    } while ((int)uVar5 <= power_exponent);
    uVar8 = uVar5 >> 2;
    uVar2 = uVar2 & 0xffff;
    uVar4 = uVar2;
    if (uVar5 < 4) {
      bVar7 = false;
    }
    else {
      bVar6 = false;
      bVar7 = false;
      uVar5 = uVar8;
      do {
        uVar4 = uVar4 * uVar4;
        if ((uVar5 & power_exponent) != 0) {
          bVar7 = bVar6;
          uVar1 = uVar2;
          if (uVar4 >> (0x40U - (char)iVar3 & 0x3f) != 0) {
            bVar7 = true;
            uVar1 = 1;
          }
          uVar4 = uVar4 * uVar1;
          bVar6 = bVar7;
        }
        uVar8 = uVar5 >> 1;
      } while ((1 < uVar5) && (uVar5 = uVar8, uVar4 >> 0x20 == 0));
    }
    AssignUInt64(this,uVar4);
    if (bVar7) {
      MultiplyByUInt32(this,factor);
    }
    if (uVar8 != 0) {
      do {
        Square(this);
        if ((uVar8 & power_exponent) != 0) {
          MultiplyByUInt32(this,factor);
        }
        bVar7 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar7);
    }
    ShiftLeft(this,iVar9 * power_exponent);
    return;
  }
  abort();
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, int power_exponent) {
  ASSERT(base != 0);
  ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multipliciation = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      uint64_t base_bits_mask =
          ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multipliciation = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multipliciation) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}